

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

string * anon_unknown.dwarf_98ca::readFileContents(string *__return_storage_ptr__,string path)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  size_t sVar3;
  undefined4 extraout_var;
  char *in_RSI;
  ulong uVar4;
  
  __stream = fopen(in_RSI,"rb");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    uVar2 = ftell(__stream);
    fseek(__stream,0,0);
    std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)uVar2);
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        sVar3 = fread((__return_storage_ptr__->_M_dataplus)._M_p + uVar4,1,uVar2 - uVar4,__stream);
        uVar4 = uVar4 + sVar3;
      } while (uVar4 < uVar2);
    }
    iVar1 = fclose(__stream);
    return (string *)CONCAT44(extraout_var,iVar1);
  }
  return (string *)&__return_storage_ptr__->field_2;
}

Assistant:

static std::string readFileContents(std::string path) {
  FILE * fp = fopen(path.c_str(), "rb");
  std::string str;
  if (fp) {
    fseek(fp, 0, SEEK_END);
    uint64_t size = ftell(fp);
    fseek(fp, 0, SEEK_SET);
    str.resize(size);
    size_t pos = 0;
    while (pos < size) {
      size_t result = fread((void *)(str.data() + pos), 1, size - pos, fp);
      pos += result;
    }
    fclose(fp);
  }
  return str;
}